

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O0

MPP_RET mpp_parser_init(Parser *prs,ParserCfg *cfg)

{
  ParserApi *pPVar1;
  MPP_RET MVar2;
  long *ptr;
  void *ptr_00;
  MPP_RET ret;
  void *ctx;
  ParserImpl *p;
  ParserApi *api;
  RK_U32 i;
  ParserCfg *cfg_local;
  Parser *prs_local;
  
  if ((prs == (Parser *)0x0) || (cfg == (ParserCfg *)0x0)) {
    _mpp_log_l(2,"mpp_dec","found NULL input parser %p config %p\n","mpp_parser_init",prs,cfg);
    prs_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *prs = (Parser)0x0;
    for (api._4_4_ = 0; api._4_4_ < 0xd; api._4_4_ = api._4_4_ + 1) {
      pPVar1 = parsers[api._4_4_];
      if (cfg->coding == pPVar1->coding) {
        ptr = (long *)mpp_osal_calloc("mpp_parser_init",0x10);
        ptr_00 = mpp_osal_calloc("mpp_parser_init",(ulong)pPVar1->ctx_size);
        if ((ptr_00 != (void *)0x0) && (ptr != (long *)0x0)) {
          MVar2 = (*pPVar1->init)(ptr_00,cfg);
          if (MVar2 != MPP_OK) {
            _mpp_log_l(2,"mpp_dec","failed to init parser\n","mpp_parser_init");
            mpp_osal_free("mpp_parser_init",ptr);
            mpp_osal_free("mpp_parser_init",ptr_00);
            return MVar2;
          }
          *ptr = (long)pPVar1;
          ptr[1] = (long)ptr_00;
          *prs = ptr;
          return MPP_OK;
        }
        _mpp_log_l(2,"mpp_dec","failed to alloc parser context\n","mpp_parser_init");
        mpp_osal_free("mpp_parser_init",ptr);
        mpp_osal_free("mpp_parser_init",ptr_00);
        return MPP_ERR_MALLOC;
      }
    }
    prs_local._4_4_ = MPP_NOK;
  }
  return prs_local._4_4_;
}

Assistant:

MPP_RET mpp_parser_init(Parser *prs, ParserCfg *cfg)
{
    if (NULL == prs || NULL == cfg) {
        mpp_err_f("found NULL input parser %p config %p\n", prs, cfg);
        return MPP_ERR_NULL_PTR;
    }

    *prs = NULL;

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(parsers); i++) {
        const ParserApi *api = parsers[i];
        if (cfg->coding == api->coding) {
            ParserImpl *p = mpp_calloc(ParserImpl, 1);
            void *ctx = mpp_calloc_size(void, api->ctx_size);
            if (NULL == ctx || NULL == p) {
                mpp_err_f("failed to alloc parser context\n");
                mpp_free(p);
                mpp_free(ctx);
                return MPP_ERR_MALLOC;
            }

            MPP_RET ret = api->init(ctx, cfg);
            if (MPP_OK != ret) {
                mpp_err_f("failed to init parser\n");
                mpp_free(p);
                mpp_free(ctx);
                return ret;
            }

            p->api  = api;
            p->ctx  = ctx;
            *prs = p;
            return MPP_OK;
        }
    }
    return MPP_NOK;
}